

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3UpsertDoUpdate(Parse *pParse,Upsert *pUpsert,Table *pTab,Index *pIdx,int iCur)

{
  byte bVar1;
  ushort uVar2;
  sqlite3 *db;
  Vdbe *p;
  i16 iVar3;
  int iVar4;
  Index *pIVar5;
  SrcList *pTabList;
  ulong uVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int p1;
  
  db = pParse->db;
  p1 = pUpsert->iDataCur;
  if (p1 != iCur && pIdx != (Index *)0x0) {
    p = pParse->pVdbe;
    if ((pTab->tabFlags & 0x20) == 0) {
      iVar4 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(p,0x88,iCur,iVar4);
      sqlite3VdbeAddOp3(p,0x1e,p1,0,iVar4);
      in_stack_ffffffffffffffb0 = p1;
      if (iVar4 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar4;
        }
      }
    }
    else {
      pIVar5 = sqlite3PrimaryKeyIndex(pTab);
      uVar2 = pIVar5->nKeyCol;
      iVar4 = pParse->nMem + 1;
      pParse->nMem = pParse->nMem + (uint)uVar2;
      for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
        iVar3 = sqlite3ColumnOfIndex(pIdx,pIVar5->aiColumn[uVar6]);
        sqlite3VdbeAddOp3(p,0x5a,iCur,(int)iVar3,iVar4 + (int)uVar6);
      }
      iVar4 = sqlite3VdbeAddOp4Int(p,0x1d,p1,0,iVar4,(uint)uVar2);
      in_stack_ffffffffffffffa8 = 0xffffffff;
      sqlite3VdbeAddOp4(p,0x45,0xb,2,0,"corrupt database",-1);
      sqlite3VdbeJumpHere(p,iVar4);
      in_stack_ffffffffffffffb0 = p1;
    }
  }
  pTabList = sqlite3SrcListDup(db,pUpsert->pUpsertSrc,0);
  sqlite3Update(pParse,pTabList,pUpsert->pUpsertSet,pUpsert->pUpsertWhere,2,(ExprList *)pUpsert,
                (Expr *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                (Upsert *)CONCAT44(iCur,in_stack_ffffffffffffffb0));
  pUpsert->pUpsertSet = (ExprList *)0x0;
  pUpsert->pUpsertWhere = (Expr *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UpsertDoUpdate(
  Parse *pParse,        /* The parsing and code-generating context */
  Upsert *pUpsert,      /* The ON CONFLICT clause for the upsert */
  Table *pTab,          /* The table being updated */
  Index *pIdx,          /* The UNIQUE constraint that failed */
  int iCur              /* Cursor for pIdx (or pTab if pIdx==NULL) */
){
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;
  SrcList *pSrc;            /* FROM clause for the UPDATE */
  int iDataCur;

  assert( v!=0 );
  assert( pUpsert!=0 );
  VdbeNoopComment((v, "Begin DO UPDATE of UPSERT"));
  iDataCur = pUpsert->iDataCur;
  if( pIdx && iCur!=iDataCur ){
    if( HasRowid(pTab) ){
      int regRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iCur, regRowid);
      sqlite3VdbeAddOp3(v, OP_SeekRowid, iDataCur, 0, regRowid);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      int nPk = pPk->nKeyCol;
      int iPk = pParse->nMem+1;
      int i;
      pParse->nMem += nPk;
      for(i=0; i<nPk; i++){
        int k;
        assert( pPk->aiColumn[i]>=0 );
        k = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iCur, k, iPk+i);
        VdbeComment((v, "%s.%s", pIdx->zName,
                    pTab->aCol[pPk->aiColumn[i]].zName));
      }
      sqlite3VdbeVerifyAbortable(v, OE_Abort);
      i = sqlite3VdbeAddOp4Int(v, OP_Found, iDataCur, 0, iPk, nPk);
      VdbeCoverage(v);
      sqlite3VdbeAddOp4(v, OP_Halt, SQLITE_CORRUPT, OE_Abort, 0, 
            "corrupt database", P4_STATIC);
      sqlite3VdbeJumpHere(v, i);
    }
  }
  /* pUpsert does not own pUpsertSrc - the outer INSERT statement does.  So
  ** we have to make a copy before passing it down into sqlite3Update() */
  pSrc = sqlite3SrcListDup(db, pUpsert->pUpsertSrc, 0);
  sqlite3Update(pParse, pSrc, pUpsert->pUpsertSet,
      pUpsert->pUpsertWhere, OE_Abort, 0, 0, pUpsert);
  pUpsert->pUpsertSet = 0;    /* Will have been deleted by sqlite3Update() */
  pUpsert->pUpsertWhere = 0;  /* Will have been deleted by sqlite3Update() */
  VdbeNoopComment((v, "End DO UPDATE of UPSERT"));
}